

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.h
# Opt level: O0

bool QVersionNumber::SegmentStorage::dataFitsInline(int *data,qsizetype len)

{
  qsizetype i;
  qsizetype len_local;
  int *data_local;
  bool local_1;
  
  if (len < 8) {
    for (i = 0; i < len; i = i + 1) {
      if (data[i] != (int)(char)data[i]) {
        return false;
      }
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool dataFitsInline(const int *data, qsizetype len)
        {
            if (len > InlineSegmentCount)
                return false;
            for (qsizetype i = 0; i < len; ++i)
                if (data[i] != qint8(data[i]))
                    return false;
            return true;
        }